

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionDefinition.h
# Opt level: O0

void __thiscall
Jinx::Impl::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,FunctionSignature *signature,FunctionCallback *callback)

{
  RuntimeID RVar1;
  size_t sVar2;
  FunctionCallback *callback_local;
  FunctionSignature *signature_local;
  FunctionDefinition *this_local;
  
  RVar1 = FunctionSignature::GetId(signature);
  this->m_id = RVar1;
  sVar2 = FunctionSignature::GetParameterCount(signature);
  this->m_parameterCount = sVar2;
  std::shared_ptr<Jinx::Buffer>::shared_ptr(&this->m_bytecode,(nullptr_t)0x0);
  this->m_offset = 0;
  FunctionSignature::GetName_abi_cxx11_(&this->m_name,signature);
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::function(&this->m_callback,callback);
  return;
}

Assistant:

FunctionDefinition(const FunctionSignature & signature, FunctionCallback callback) :
			m_id(signature.GetId()),
			m_parameterCount(signature.GetParameterCount()),
			m_bytecode(nullptr),
			m_offset(0),
			m_name(signature.GetName()),
			m_callback(callback)
		{}